

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O1

void __thiscall QToolBoxPrivate::_q_buttonClicked(QToolBoxPrivate *this)

{
  QToolBox *this_00;
  pointer puVar1;
  pointer puVar2;
  Page *pPVar3;
  int index;
  QToolBoxButton *pQVar4;
  pointer puVar5;
  QWidget *widget;
  
  this_00 = *(QToolBox **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  QObject::sender();
  pQVar4 = (QToolBoxButton *)QMetaObject::cast((QObject *)&QToolBoxButton::staticMetaObject);
  puVar1 = (this->pageList).
           super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->pageList).
           super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar1 == puVar2) {
    widget = (QWidget *)0x0;
  }
  else {
    widget = (QWidget *)0x0;
    do {
      puVar5 = puVar1 + 1;
      pPVar3 = (puVar1->_M_t).
               super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
               ._M_t.
               super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
               .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl;
      if (pPVar3->button == pQVar4) {
        widget = pPVar3->widget;
        break;
      }
      puVar1 = puVar5;
    } while (puVar5 != puVar2);
  }
  index = QToolBox::indexOf(this_00,widget);
  QToolBox::setCurrentIndex(this_00,index);
  return;
}

Assistant:

void QToolBoxPrivate::_q_buttonClicked()
{
    Q_Q(QToolBox);
    QToolBoxButton *tb = qobject_cast<QToolBoxButton*>(q->sender());
    QWidget* item = nullptr;
    for (const auto &page : pageList) {
        if (page->button == tb) {
            item = page->widget;
            break;
        }
    }

    q->setCurrentIndex(q->indexOf(item));
}